

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void prf_node_clear(prf_node_t *node)

{
  prf_node_t *node_local;
  
  if (node != (prf_node_t *)0x0) {
    node->opcode = 0;
    node->length = 4;
    node->flags = 0;
    node->data = (uint8_t *)0x0;
    node->children = (prf_node_t **)0x0;
    node->parent = (prf_node_t *)0x0;
    node->userdata = (void *)0x0;
  }
  return;
}

Assistant:

void
prf_node_clear(
    prf_node_t * node )
{
    if ( node != NULL ) {
        node->opcode = 0;
        node->length = 4;
        node->flags = 0;
        node->data = NULL;
        node->children = NULL;
        node->parent = NULL;
        node->userdata = NULL;
    }
}